

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt.c
# Opt level: O1

dropt_error parse_option_arg(dropt_context *context,parse_state *ps)

{
  dropt_option *option;
  bool bVar1;
  dropt_error dVar2;
  
  option = ps->option;
  bVar1 = false;
  if (option->arg_description != (dropt_char *)0x0) {
    if (ps->optionArgument == (dropt_char *)0x0) {
      if ((ps->argsLeft < 1) || (*ps->argNext == (dropt_char *)0x0)) {
        dVar2 = 5;
        bVar1 = false;
        if ((option->attr & 4) == 0) goto LAB_0010357b;
      }
      else {
        ps->optionArgument = *ps->argNext;
        bVar1 = true;
      }
    }
    else {
      bVar1 = false;
    }
  }
  dVar2 = set_option_value(context,option,ps->optionArgument);
  if (dVar2 == 0) {
    dVar2 = 0;
  }
  else if ((((ps->option->attr & 4) != 0) && (bVar1)) && (ps->optionArgument != (dropt_char *)0x0))
  {
    ps->optionArgument = (dropt_char *)0x0;
    bVar1 = false;
    dVar2 = set_option_value(context,ps->option,(dropt_char *)0x0);
  }
LAB_0010357b:
  if ((dVar2 == 0) && (bVar1)) {
    ps->argNext = ps->argNext + 1;
    ps->argsLeft = ps->argsLeft + -1;
  }
  return dVar2;
}

Assistant:

static dropt_error
parse_option_arg(dropt_context* context, parse_state* ps)
{
    dropt_error err;

    bool consumeNextArg = false;

    if (OPTION_TAKES_ARG(ps->option) && ps->optionArgument == NULL)
    {
        /* The option expects an argument, but none was specified with '='.
         * Try using the next item from the command-line.
         */
        if (ps->argsLeft > 0 && *(ps->argNext) != NULL)
        {
            consumeNextArg = true;
            ps->optionArgument = *(ps->argNext);
        }
        else if (!(ps->option->attr & dropt_attr_optional_val))
        {
            err = dropt_error_insufficient_arguments;
            goto exit;
        }
    }

    /* Even for options that don't ask for arguments, always parse and
     * consume an argument that was specified with '='.
     */
    err = set_option_value(context, ps->option, ps->optionArgument);

    if (   err != dropt_error_none
        && (ps->option->attr & dropt_attr_optional_val)
        && consumeNextArg
        && ps->optionArgument != NULL)
    {
        /* The option's handler didn't like the argument we fed it.  If the
         * argument was optional, try again without it.
         */
        consumeNextArg = false;
        ps->optionArgument = NULL;
        err = set_option_value(context, ps->option, NULL);
    }

exit:
    if (err == dropt_error_none && consumeNextArg)
    {
        ps->argNext++;
        ps->argsLeft--;
    }
    return err;
}